

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_context_uninit(ma_context *pContext)

{
  ma_context *pmVar1;
  ma_result mVar2;
  ma_context *UNRECOVERED_JUMPTABLE;
  
  if (pContext != (ma_context *)0x0) {
    (*pContext->onUninit)(pContext);
    pmVar1 = (pContext->deviceEnumLock).pContext;
    if (pmVar1 != (ma_context *)0x0) {
      (*(pmVar1->field_22).posix.pthread_mutex_destroy)(&(pContext->deviceEnumLock).field_1);
    }
    UNRECOVERED_JUMPTABLE = (pContext->deviceInfoLock).pContext;
    if (UNRECOVERED_JUMPTABLE != (ma_context *)0x0) {
      UNRECOVERED_JUMPTABLE =
           (ma_context *)
           (*(UNRECOVERED_JUMPTABLE->field_22).posix.pthread_mutex_destroy)
                     (&(pContext->deviceInfoLock).field_1);
    }
    if ((pContext->pDeviceInfos != (ma_device_info *)0x0) &&
       (UNRECOVERED_JUMPTABLE = (ma_context *)(pContext->allocationCallbacks).onFree,
       UNRECOVERED_JUMPTABLE != (ma_context *)0x0)) {
      mVar2 = (*(code *)UNRECOVERED_JUMPTABLE)
                        (pContext->pDeviceInfos,(pContext->allocationCallbacks).pUserData);
      return mVar2;
    }
  }
  return (ma_result)UNRECOVERED_JUMPTABLE;
}

Assistant:

MA_API ma_result ma_context_uninit(ma_context* pContext)
{
    if (pContext == NULL) {
        return MA_INVALID_ARGS;
    }

    pContext->onUninit(pContext);

    ma_mutex_uninit(&pContext->deviceEnumLock);
    ma_mutex_uninit(&pContext->deviceInfoLock);
    ma__free_from_callbacks(pContext->pDeviceInfos, &pContext->allocationCallbacks);
    ma_context_uninit_backend_apis(pContext);

    return MA_SUCCESS;
}